

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall
Assimp::XFileParser::ParseDataObjectAnimationKey(XFileParser *this,AnimBone *pAnimBone)

{
  pointer *ppMVar1;
  pointer *ppaVar2;
  pointer *ppaVar3;
  iterator __position;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  double *pdVar10;
  iterator __position_00;
  iterator __position_01;
  vector<aiVectorKey,std::allocator<aiVectorKey>> *this_00;
  byte bVar11;
  ai_real aVar12;
  aiVector3D aVar13;
  MatrixKey key;
  undefined1 local_1c8 [32];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float local_198;
  undefined8 local_194;
  undefined8 uStack_18c;
  float local_184;
  string local_50;
  
  bVar11 = 0;
  readHeadOfDataObject(this,(string *)0x0);
  uVar5 = ReadInt(this);
  uVar6 = ReadInt(this);
  if (uVar6 != 0) {
    do {
      uVar7 = ReadInt(this);
      if (uVar5 - 1 < 2) {
        uVar8 = ReadInt(this);
        if (uVar8 != 3) {
          local_1c8._0_8_ = local_1c8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,"Invalid number of arguments for vector key in animation",
                     "");
          ThrowException(this,(string *)local_1c8);
        }
        local_1c8._8_4_ = 0.0;
        local_1c8._12_4_ = 0.0;
        local_1c8._16_4_ = 0.0;
        local_1c8._0_8_ = (undefined8)uVar7;
        aVar13 = ReadVector3(this);
        local_1c8._16_4_ = aVar13.z;
        uVar4 = aVar13._0_8_;
        local_1c8._8_4_ = aVar13.x;
        local_1c8._12_4_ = aVar13.y;
        if (uVar5 == 2) {
          __position_00._M_current =
               (pAnimBone->mPosKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          this_00 = (vector<aiVectorKey,std::allocator<aiVectorKey>> *)&pAnimBone->mPosKeys;
          if (__position_00._M_current ==
              (pAnimBone->mPosKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_00634b59:
            std::vector<aiVectorKey,std::allocator<aiVectorKey>>::
            _M_realloc_insert<aiVectorKey_const&>(this_00,__position_00,(aiVectorKey *)local_1c8);
          }
          else {
            *(ulong *)&((__position_00._M_current)->mValue).z =
                 CONCAT44(local_1c8._20_4_,local_1c8._16_4_);
            (__position_00._M_current)->mTime = (double)local_1c8._0_8_;
            ((__position_00._M_current)->mValue).x = (float)(int)uVar4;
            ((__position_00._M_current)->mValue).y = (float)(int)((ulong)uVar4 >> 0x20);
            ppaVar2 = &(pAnimBone->mPosKeys).
                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppaVar2 = *ppaVar2 + 1;
          }
        }
        else {
          __position_00._M_current =
               (pAnimBone->mScaleKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          this_00 = (vector<aiVectorKey,std::allocator<aiVectorKey>> *)&pAnimBone->mScaleKeys;
          if (__position_00._M_current ==
              (pAnimBone->mScaleKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00634b59;
          *(ulong *)&((__position_00._M_current)->mValue).z =
               CONCAT44(local_1c8._20_4_,local_1c8._16_4_);
          (__position_00._M_current)->mTime = (double)local_1c8._0_8_;
          ((__position_00._M_current)->mValue).x = (float)(int)uVar4;
          ((__position_00._M_current)->mValue).y = (float)(int)((ulong)uVar4 >> 0x20);
          ppaVar2 = &(pAnimBone->mScaleKeys).
                     super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppaVar2 = *ppaVar2 + 1;
        }
      }
      else {
        if (uVar5 - 3 < 2) {
          uVar8 = ReadInt(this);
          if (uVar8 != 0x10) {
            local_1c8._0_8_ = local_1c8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,"Invalid number of arguments for matrix key in animation"
                       ,"");
            ThrowException(this,(string *)local_1c8);
          }
          local_1c8._8_4_ = 1.0;
          local_1c8._12_4_ = 0.0;
          local_1c8._16_4_ = 0.0;
          local_1c8._20_4_ = 0.0;
          local_1c8._24_4_ = 0.0;
          local_1c8._28_4_ = 1.0;
          local_1a8._0_4_ = 0.0;
          local_1a8._4_4_ = 0.0;
          uStack_1a0._0_4_ = 0.0;
          uStack_1a0._4_4_ = 0.0;
          local_198 = 1.0;
          local_194._0_4_ = 0.0;
          local_194._4_4_ = 0.0;
          uStack_18c._0_4_ = 0.0;
          uStack_18c._4_4_ = 0.0;
          local_184 = 1.0;
          local_1c8._0_8_ = (undefined8)uVar7;
          local_1c8._8_4_ = ReadFloat(this);
          local_1c8._24_4_ = ReadFloat(this);
          aVar12 = ReadFloat(this);
          uStack_1a0._0_4_ = aVar12;
          aVar12 = ReadFloat(this);
          local_194._4_4_ = aVar12;
          local_1c8._12_4_ = ReadFloat(this);
          local_1c8._28_4_ = ReadFloat(this);
          aVar12 = ReadFloat(this);
          uStack_1a0._4_4_ = aVar12;
          aVar12 = ReadFloat(this);
          uStack_18c._0_4_ = aVar12;
          local_1c8._16_4_ = ReadFloat(this);
          aVar12 = ReadFloat(this);
          local_1a8._0_4_ = aVar12;
          local_198 = ReadFloat(this);
          aVar12 = ReadFloat(this);
          uStack_18c._4_4_ = aVar12;
          local_1c8._20_4_ = ReadFloat(this);
          aVar12 = ReadFloat(this);
          local_1a8._4_4_ = aVar12;
          local_194._0_4_ = ReadFloat(this);
          local_184 = ReadFloat(this);
          __position_01._M_current =
               (pAnimBone->mTrafoKeys).
               super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position_01._M_current ==
              (pAnimBone->mTrafoKeys).
              super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Assimp::XFile::MatrixKey,std::allocator<Assimp::XFile::MatrixKey>>::
            _M_realloc_insert<Assimp::XFile::MatrixKey_const&>
                      ((vector<Assimp::XFile::MatrixKey,std::allocator<Assimp::XFile::MatrixKey>> *)
                       &pAnimBone->mTrafoKeys,__position_01,(MatrixKey *)local_1c8);
          }
          else {
            pdVar10 = (double *)local_1c8;
            for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
              (__position_01._M_current)->mTime = *pdVar10;
              pdVar10 = pdVar10 + (ulong)bVar11 * -2 + 1;
              __position_01._M_current = __position_01._M_current + (ulong)bVar11 * -0x10 + 8;
            }
            ppMVar1 = &(pAnimBone->mTrafoKeys).
                       super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppMVar1 = *ppMVar1 + 1;
          }
        }
        else {
          if (uVar5 != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,"Unknown key type ",0x11);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8," in animation.",0xe);
            std::__cxx11::stringbuf::str();
            ThrowException(this,&local_50);
          }
          uVar8 = ReadInt(this);
          if (uVar8 != 4) {
            local_1c8._0_8_ = local_1c8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,
                       "Invalid number of arguments for quaternion key in animation","");
            ThrowException(this,(string *)local_1c8);
          }
          local_1c8._8_4_ = 1.0;
          local_1c8._12_4_ = 0.0;
          local_1c8._16_4_ = 0.0;
          local_1c8._20_4_ = 0.0;
          local_1c8._0_8_ = (undefined8)uVar7;
          local_1c8._8_4_ = ReadFloat(this);
          local_1c8._12_4_ = ReadFloat(this);
          local_1c8._16_4_ = ReadFloat(this);
          local_1c8._20_4_ = ReadFloat(this);
          __position._M_current =
               (pAnimBone->mRotKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pAnimBone->mRotKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiQuatKey,std::allocator<aiQuatKey>>::_M_realloc_insert<aiQuatKey_const&>
                      ((vector<aiQuatKey,std::allocator<aiQuatKey>> *)&pAnimBone->mRotKeys,
                       __position,(aiQuatKey *)local_1c8);
          }
          else {
            ((__position._M_current)->mValue).y = (float)local_1c8._16_4_;
            ((__position._M_current)->mValue).z = (float)local_1c8._20_4_;
            (__position._M_current)->mTime = (double)local_1c8._0_8_;
            ((__position._M_current)->mValue).w = (float)local_1c8._8_4_;
            ((__position._M_current)->mValue).x = (float)local_1c8._12_4_;
            ppaVar3 = &(pAnimBone->mRotKeys).
                       super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppaVar3 = *ppaVar3 + 1;
          }
        }
        CheckForSemicolon(this);
      }
      CheckForSeparator(this);
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  CheckForClosingBrace(this);
  return;
}

Assistant:

void XFileParser::ParseDataObjectAnimationKey( AnimBone* pAnimBone)
{
    readHeadOfDataObject();

    // read key type
    unsigned int keyType = ReadInt();

    // read number of keys
    unsigned int numKeys = ReadInt();

    for( unsigned int a = 0; a < numKeys; a++)
    {
        // read time
        unsigned int time = ReadInt();

        // read keys
        switch( keyType)
        {
            case 0: // rotation quaternion
            {
                // read count
                if( ReadInt() != 4)
                    ThrowException( "Invalid number of arguments for quaternion key in animation");

                aiQuatKey key;
                key.mTime = double( time);
                key.mValue.w = ReadFloat();
                key.mValue.x = ReadFloat();
                key.mValue.y = ReadFloat();
                key.mValue.z = ReadFloat();
                pAnimBone->mRotKeys.push_back( key);

                CheckForSemicolon();
                break;
            }

            case 1: // scale vector
            case 2: // position vector
            {
                // read count
                if( ReadInt() != 3)
                    ThrowException( "Invalid number of arguments for vector key in animation");

                aiVectorKey key;
                key.mTime = double( time);
                key.mValue = ReadVector3();

                if( keyType == 2)
                    pAnimBone->mPosKeys.push_back( key);
                else
                    pAnimBone->mScaleKeys.push_back( key);

                break;
            }

            case 3: // combined transformation matrix
            case 4: // denoted both as 3 or as 4
            {
                // read count
                if( ReadInt() != 16)
                    ThrowException( "Invalid number of arguments for matrix key in animation");

                // read matrix
                MatrixKey key;
                key.mTime = double( time);
                key.mMatrix.a1 = ReadFloat(); key.mMatrix.b1 = ReadFloat();
                key.mMatrix.c1 = ReadFloat(); key.mMatrix.d1 = ReadFloat();
                key.mMatrix.a2 = ReadFloat(); key.mMatrix.b2 = ReadFloat();
                key.mMatrix.c2 = ReadFloat(); key.mMatrix.d2 = ReadFloat();
                key.mMatrix.a3 = ReadFloat(); key.mMatrix.b3 = ReadFloat();
                key.mMatrix.c3 = ReadFloat(); key.mMatrix.d3 = ReadFloat();
                key.mMatrix.a4 = ReadFloat(); key.mMatrix.b4 = ReadFloat();
                key.mMatrix.c4 = ReadFloat(); key.mMatrix.d4 = ReadFloat();
                pAnimBone->mTrafoKeys.push_back( key);

                CheckForSemicolon();
                break;
            }

            default:
                ThrowException( format() << "Unknown key type " << keyType << " in animation." );
                break;
        } // end switch

        // key separator
        CheckForSeparator();
    }

    CheckForClosingBrace();
}